

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-time-logger-def.h
# Opt level: O2

void __thiscall dynamicgraph::RTLoggerStream::~RTLoggerStream(RTLoggerStream *this)

{
  if (this->ok_ == true) {
    std::ends<char,std::char_traits<char>>(this->os_);
    RealTimeLogger::frontReady(this->logger_);
  }
  return;
}

Assistant:

RTLoggerStream::~RTLoggerStream() {
  if (ok_) {
    os_ << std::ends;
    logger_->frontReady();
  }
}